

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O3

int connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  rpchook_t *prVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  int err;
  socklen_t errlen;
  pollfd local_40;
  int local_38 [2];
  
  if (g_sys_connect_func == (connect_pfn_t)0x0) {
    g_sys_connect_func = (connect_pfn_t)dlsym(0xffffffffffffffff,"connect");
  }
  bVar2 = co_is_enable_sys_hook();
  iVar3 = (*g_sys_connect_func)(__fd,(sockaddr *)__addr,__len);
  if (((uint)__fd < 1000000 && bVar2) &&
     (prVar1 = g_rpchook_socket_fd[(uint)__fd], prVar1 != (rpchook_t *)0x0)) {
    if (__len < 0x11) {
      memcpy(&prVar1->dest,__addr,(ulong)__len);
    }
    if (((iVar3 < 0) && ((prVar1->user_flag & 0x800U) == 0)) &&
       (piVar5 = __errno_location(), *piVar5 == 0x73)) {
      iVar6 = 2;
      do {
        local_40.events = 0x1c;
        local_40.revents = 0;
        local_40.fd = __fd;
        iVar4 = poll(&local_40,1,25000);
        bVar2 = iVar6 != 0;
        iVar6 = iVar6 + -1;
        if (iVar4 == 1) break;
      } while (bVar2);
      if (((ulong)local_40 & 0x4000000000000) == 0) {
        *piVar5 = 0x6e;
      }
      else {
        local_38[0] = 0;
        local_38[1] = 4;
        iVar3 = getsockopt(__fd,1,4,local_38,(socklen_t *)(local_38 + 1));
        if (-1 < iVar3) {
          *piVar5 = local_38[0];
          iVar3 = -(uint)(local_38[0] != 0);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int connect(int fd, const struct sockaddr *address, socklen_t address_len)
{
	HOOK_SYS_FUNC( connect );

	if( !co_is_enable_sys_hook() )
	{
		return g_sys_connect_func(fd,address,address_len);
	}

	//1.sys call
	int ret = g_sys_connect_func( fd,address,address_len );

	rpchook_t *lp = get_by_fd( fd );
	if( !lp ) return ret;

	if( sizeof(lp->dest) >= address_len )
	{
		 memcpy( &(lp->dest),address,(int)address_len );
	}
	if( O_NONBLOCK & lp->user_flag ) 
	{
		return ret;
	}
	
	if (!(ret < 0 && errno == EINPROGRESS))
	{
		return ret;
	}

	//2.wait
	int pollret = 0;
	struct pollfd pf = { 0 };

	for(int i=0;i<3;i++) //25s * 3 = 75s
	{
		memset( &pf,0,sizeof(pf) );
		pf.fd = fd;
		pf.events = ( POLLOUT | POLLERR | POLLHUP );

		pollret = poll( &pf,1,25000 );

		if( 1 == pollret  )
		{
			break;
		}
	}

	if( pf.revents & POLLOUT ) //connect succ
	{
    // 3.check getsockopt ret
    int err = 0;
    socklen_t errlen = sizeof(err);
    ret = getsockopt(fd, SOL_SOCKET, SO_ERROR, &err, &errlen);
    if (ret < 0) {
      return ret;
    } else if (err != 0) {
      errno = err;
      return -1;
    }
    errno = 0;
    return 0;
  }

  errno = ETIMEDOUT;
	return ret;
}